

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc.cc
# Opt level: O0

void __thiscall
tchecker::system::locs_t::add_location
          (locs_t *this,process_id_t pid,string *name,attributes_t *attributes)

{
  bool bVar1;
  loc_id_t lVar2;
  size_type sVar3;
  runtime_error *this_00;
  loc_t *this_01;
  reference this_02;
  reference pvVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
  *__x;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
  *__y;
  __shared_ptr_access<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *this_04;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar5;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  range;
  loc_shared_ptr_t loc;
  loc_id_t id;
  attributes_t *attributes_local;
  string *name_local;
  process_id_t pid_local;
  locs_t *this_local;
  
  sVar3 = std::
          vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
          ::size(&this->_locs);
  bVar1 = valid_loc_id((loc_id_t)sVar3);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"add_location: invalid location identifier");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (loc_t *)operator_new(0x60);
  loc_t::loc_t(this_01,pid,(loc_id_t)sVar3,name,attributes);
  std::shared_ptr<tchecker::system::loc_t>::shared_ptr<tchecker::system::loc_t,void>
            ((shared_ptr<tchecker::system::loc_t> *)&range._end,this_01);
  sVar3 = std::
          vector<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
          ::size(&this->_locs_index);
  if (sVar3 <= pid) {
    std::
    vector<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
    ::resize(&this->_locs_index,(ulong)(pid + 1));
  }
  this_02 = std::
            vector<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>,_std::allocator<tchecker::index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>_>_>
            ::operator[](&this->_locs_index,(ulong)pid);
  index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::system::loc_t>_>
  ::add(this_02,name,(shared_ptr<tchecker::system::loc_t> *)&range._end);
  sVar3 = std::
          vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
          ::size(&this->_process_locs);
  if (sVar3 <= pid) {
    std::
    vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
    ::resize(&this->_process_locs,(ulong)(pid + 1));
  }
  pvVar4 = std::
           vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
           ::operator[](&this->_process_locs,(ulong)pid);
  std::
  vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
  ::push_back(pvVar4,(value_type *)&range._end);
  std::
  vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
  ::push_back(&this->_locs,(value_type *)&range._end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"initial",&local_81);
  rVar5 = attributes_t::range(attributes,&local_80);
  range._begin = rVar5._end.super_const_iterator.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                 ._M_cur;
  local_60 = (undefined1  [8])
             rVar5._begin.super_const_iterator.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
             ._M_cur;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  __x = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
         *)range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
           ::begin((range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
                    *)local_60);
  __y = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
         *)range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
           ::end((range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
                  *)local_60);
  bVar1 = std::__detail::operator!=(__x,__y);
  if (bVar1) {
    sVar3 = std::
            vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
            ::size(&this->_initial_locs);
    if (sVar3 <= pid) {
      std::
      vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
      ::resize(&this->_initial_locs,(ulong)(pid + 1));
    }
    pvVar4 = std::
             vector<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>,_std::allocator<std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>_>
             ::operator[](&this->_initial_locs,(ulong)pid);
    std::
    vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
    ::push_back(pvVar4,(value_type *)&range._end);
  }
  this_03 = (__shared_ptr_access<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
               ::back(&this->_locs);
  this_04 = std::
            __shared_ptr_access<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_03);
  lVar2 = loc_t::id(this_04);
  sVar3 = std::
          vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
          ::size(&this->_locs);
  if ((ulong)lVar2 != sVar3 - 1) {
    __assert_fail("_locs.back()->id() == _locs.size() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/system/loc.cc"
                  ,0x5c,
                  "void tchecker::system::locs_t::add_location(tchecker::process_id_t, const std::string &, const tchecker::system::attributes_t &)"
                 );
  }
  std::shared_ptr<tchecker::system::loc_t>::~shared_ptr
            ((shared_ptr<tchecker::system::loc_t> *)&range._end);
  return;
}

Assistant:

void locs_t::add_location(tchecker::process_id_t pid, std::string const & name,
                          tchecker::system::attributes_t const & attributes)
{
  tchecker::loc_id_t id = _locs.size();

  if (!tchecker::valid_loc_id(id))
    throw std::runtime_error("add_location: invalid location identifier");

  tchecker::system::loc_shared_ptr_t loc(new tchecker::system::loc_t(pid, id, name, attributes));

  if (pid >= _locs_index.size())
    _locs_index.resize(pid + 1);
  _locs_index[pid].add(name, loc); // may throw

  if (pid >= _process_locs.size())
    _process_locs.resize(pid + 1);
  _process_locs[pid].push_back(loc);

  _locs.push_back(loc);

  auto range = attributes.range("initial");
  if (range.begin() != range.end()) {
    if (pid >= _initial_locs.size())
      _initial_locs.resize(pid + 1);
    _initial_locs[pid].push_back(loc);
  }

  assert(_locs.back()->id() == _locs.size() - 1);
}